

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::runSample
          (BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
           *this,int iteration,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *sample)

{
  uint bufferSize;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type __n;
  uint bufferSize_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dummyData;
  Random rng;
  allocator_type local_62;
  allocator_type local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  long local_48;
  deRandom local_40;
  long lVar4;
  
  iVar1 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_48 = CONCAT44(extraout_var,iVar1);
  bufferSize = sample->bufferSize;
  if (this->m_caseType != CASE_NO_BUFFERS) {
    iVar1 = sample->allocatedSize;
    __n = (size_type)iVar1;
    iVar2 = (*((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
               ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var_00,iVar2);
    if (this->m_caseType != CASE_NO_BUFFERS) {
      (**(code **)(lVar4 + 0x6c8))
                (1,&(this->
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    ).m_bufferID);
      (**(code **)(lVar4 + 0x40))
                (0x8892,(this->
                        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                        ).m_bufferID);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Buffer gen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x952);
      if (this->m_caseType == CASE_UNSPECIFIED_BUFFER) {
        (**(code **)(lVar4 + 0x150))(0x8892,__n,0,this->m_bufferUsage);
      }
      else {
        if (this->m_caseType == CASE_NEW_BUFFER) {
          deRandom_init(&local_40,iteration * 0xbadc);
          dVar3 = deRandom_getUint32(&local_40);
          bufferSize_00 = dVar3 % 0x1ffff5 + 0x10000f & 0x3ffff0;
          local_62 = (allocator_type)0x20;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_60,(ulong)bufferSize_00,(value_type_conflict5 *)&local_62,&local_61);
          (**(code **)(lVar4 + 0x40))(0x8892,this->m_dummyBufferID);
          (**(code **)(lVar4 + 0x150))
                    (0x8892,(ulong)bufferSize_00,
                     local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,this->m_bufferUsage);
          useBuffer(this,bufferSize_00);
          if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_01307ba1;
        }
        local_40.x._0_1_ = 0x20;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_60,__n,(value_type_conflict5 *)&local_40,&local_62);
        (**(code **)(lVar4 + 0x150))
                  (0x8892,__n,
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,this->m_bufferUsage);
        if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((this->m_caseType & ~CASE_NEW_BUFFER) != CASE_UNSPECIFIED_BUFFER) {
        useBuffer(this,iVar1);
      }
    }
  }
LAB_01307ba1:
  deYield();
  tcu::warmupCPU();
  deYield();
  (*(this->
    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>)
    .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])(this,sample,(ulong)bufferSize);
  dVar3 = (**(code **)(local_48 + 0x800))();
  glu::checkError(dVar3,"Buffer upload sample",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x939);
  if (this->m_caseType != CASE_NO_BUFFERS) {
    iVar1 = (*((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
               ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var_01,iVar1);
    (**(code **)(lVar4 + 0x40))
              (0x8892,(this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).m_bufferID);
    if (this->m_bufferUnspecifiedContent == true) {
      local_40.x._0_1_ = 0x20;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_60,(long)(int)bufferSize,(value_type_conflict5 *)&local_40,&local_62);
      (**(code **)(lVar4 + 0x150))
                (0x8892,(long)(int)bufferSize,
                 local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,this->m_bufferUsage);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"re-specify buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                      ,0x992);
      if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    useBuffer(this,bufferSize);
    (**(code **)(lVar4 + 0x438))
              (1,&(this->
                  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                  ).m_bufferID);
    (this->
    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>)
    .m_bufferID = 0;
  }
  return true;
}

Assistant:

bool BasicUploadCase<SampleType>::runSample (int iteration, UploadSampleResult<SampleType>& sample)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const int				allocatedBufferSize	= sample.allocatedSize;
	const int				bufferSize			= sample.bufferSize;

	if (m_caseType != CASE_NO_BUFFERS)
		createBuffer(iteration, allocatedBufferSize);

	// warmup CPU before the test to make sure the power management governor
	// keeps us in the "high performance" mode
	{
		deYield();
		tcu::warmupCPU();
		deYield();
	}

	testBufferUpload(sample, bufferSize);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer upload sample");

	if (m_caseType != CASE_NO_BUFFERS)
		deleteBuffer(bufferSize);

	return true;
}